

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collections.cpp
# Opt level: O2

Oop Lodtalk::ByteString::splitVariableNames(VMContext *context,string *string)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  Oop OVar4;
  int iVar5;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar6;
  Array *pAVar7;
  size_t i_1;
  ulong uVar8;
  size_t i;
  ulong uVar9;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> varNameIndices;
  Ref<Lodtalk::Array> result;
  
  varNameIndices.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  varNameIndices.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  varNameIndices.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar2 = (string->_M_dataplus)._M_p;
  sVar3 = string->_M_string_length;
  uVar8 = 0xffffffff;
  for (uVar9 = 0; iVar5 = (int)uVar8, sVar3 != uVar9; uVar9 = uVar9 + 1) {
    cVar1 = pcVar2[uVar9];
    if (iVar5 < 0) {
      if (' ' < cVar1) {
        uVar8 = uVar9 & 0xffffffff;
      }
    }
    else if (cVar1 < '!') {
      result.reference.oop.field_0.uintValue._4_4_ = (int)uVar9 - iVar5;
      result.reference.oop.field_0.intValue._0_4_ = iVar5;
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      emplace_back<std::pair<int,int>>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&varNameIndices,
                 (pair<int,_int> *)&result);
      uVar8 = 0xffffffff;
    }
  }
  if (-1 < iVar5) {
    result.reference.oop.field_0.uintValue._4_4_ = (int)sVar3 - iVar5;
    result.reference.oop.field_0.intValue._0_4_ = iVar5;
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    emplace_back<std::pair<int,int>>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&varNameIndices,
               (pair<int,_int> *)&result);
  }
  aVar6.header = (ObjectHeader *)
                 Array::basicNativeNew
                           (context,(long)varNameIndices.
                                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)varNameIndices.
                                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3);
  OopRef::OopRef(&result.reference,context);
  result.reference.oop.field_0 =
       (anon_union_8_4_0eb573b0_for_Oop_0)(anon_union_8_4_0eb573b0_for_Oop_0)aVar6.header;
  for (uVar8 = 0; OVar4.field_0 = result.reference.oop.field_0,
      uVar8 < (ulong)((long)varNameIndices.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)varNameIndices.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1) {
    aVar6 = (anon_union_8_4_0eb573b0_for_Oop_0)
            ByteSymbol::fromNativeRange
                      (context,pcVar2 + varNameIndices.
                                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar8].first,
                       (long)varNameIndices.
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar8].second);
    pAVar7 = Ref<Lodtalk::Array>::operator->(&result);
    *(anon_union_8_4_0eb573b0_for_Oop_0 *)(pAVar7 + uVar8 + 1) = aVar6;
  }
  OopRef::~OopRef(&result.reference);
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            (&varNameIndices.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
  return (Oop)OVar4.field_0.pointer;
}

Assistant:

Oop ByteString::splitVariableNames(VMContext *context, const std::string &string)
{
	std::vector<std::pair<int, int>> varNameIndices;

	auto data = string.data();
	auto size = string.size();
	int tokenStart = -1;

	for(size_t i = 0; i < size; ++i)
	{
		auto c = data[i];
		if(tokenStart < 0)
		{
			// I am not in a token.
			if(c > ' ')
				tokenStart = (int)i;
		}
		else
		{
			// Inside token.
			if(c <= ' ')
			{
				varNameIndices.push_back(std::make_pair(tokenStart, i - tokenStart));
				tokenStart = -1;
			}
		}
	}

	// Push the last token.
	if(tokenStart >= 0)
		varNameIndices.push_back(std::make_pair(tokenStart, size - tokenStart));

	// Allocate the result.
	Ref<Array> result(context, Array::basicNativeNew(context, varNameIndices.size()));
	for(size_t i = 0; i < varNameIndices.size(); ++i)
	{
		auto &startSize = varNameIndices[i];
		auto subString = ByteSymbol::fromNativeRange(context, (char*)data + startSize.first, startSize.second);
		auto resultData = reinterpret_cast<Oop*> (result->getFirstFieldPointer());
		resultData[i] = subString;
	}

	return result.getOop();
}